

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O1

double LZ77OptimalRun(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,
                     unsigned_short **path,size_t *pathsize,unsigned_short *length_array,
                     CostModelFun *costmodel,void *costcontext,ZopfliLZ77Store *store,ZopfliHash *h,
                     float *costs)

{
  unsigned_short uVar1;
  ushort length;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t end;
  unsigned_short **ppuVar5;
  ulong *puVar6;
  float *pfVar7;
  ulong uVar8;
  unsigned_short *puVar9;
  long lVar10;
  uchar *array;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  unsigned_short *puVar15;
  size_t pos;
  double dVar16;
  int iVar19;
  double dVar17;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  unsigned_short leng;
  double local_2c0;
  size_t local_2b8;
  double local_2b0;
  size_t local_2a8;
  unsigned_short *local_2a0;
  uchar *local_298;
  unsigned_short dist;
  long local_288;
  ZopfliBlockState *local_280;
  unsigned_short **local_278;
  ulong *local_270;
  float *local_268;
  unsigned_short *local_260;
  float *local_258;
  unsigned_short *local_250;
  double local_248;
  ulong local_240;
  unsigned_short sublen [259];
  
  uVar12 = 3;
  dVar16 = 1e+30;
  local_2b8 = inend;
  local_2a8 = instart;
  local_298 = in;
  local_280 = s;
  local_278 = path;
  local_270 = pathsize;
  uVar13 = 0;
  do {
    local_2c0 = dVar16;
    dVar16 = (*costmodel)(uVar12,1,costcontext);
    uVar2 = uVar12;
    if (local_2c0 <= dVar16) {
      dVar16 = local_2c0;
      uVar2 = uVar13;
    }
    uVar12 = uVar12 + 1;
    uVar13 = uVar2;
  } while (uVar12 != 0x103);
  lVar10 = 0;
  dVar16 = 1e+30;
  uVar13 = 0;
  do {
    uVar12 = *(uint *)((long)&GetCostModelMinCost_dsymbols + lVar10);
    local_2c0 = dVar16;
    dVar16 = (*costmodel)(3,uVar12,costcontext);
    if (local_2c0 <= dVar16) {
      dVar16 = local_2c0;
      uVar12 = uVar13;
    }
    uVar13 = uVar12;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x78);
  local_248 = (*costmodel)(uVar2,uVar13,costcontext);
  array = local_298;
  pos = local_2a8;
  sVar14 = local_2b8;
  local_288 = local_2b8 - local_2a8;
  if (local_288 != 0) {
    uVar8 = 0;
    if (0x7fff < local_2a8) {
      uVar8 = local_2a8 - 0x8000;
    }
    ZopfliResetHash(0x8000,h);
    ZopfliWarmupHash(array,uVar8,sVar14,h);
    if (uVar8 < pos) {
      uVar8 = 0x8000;
      if (pos < 0x8000) {
        uVar8 = pos;
      }
      lVar10 = -uVar8;
      do {
        ZopfliUpdateHash(array,lVar10 + pos,sVar14,h);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0);
    }
    auVar4 = _DAT_0012a3b0;
    auVar3 = _DAT_0012a3a0;
    auVar20 = _DAT_0012a390;
    uVar8 = local_288 - 1;
    if (uVar8 < 0xfffffffffffffffe) {
      auVar18._8_4_ = (int)uVar8;
      auVar18._0_8_ = uVar8;
      auVar18._12_4_ = (int)(uVar8 >> 0x20);
      uVar8 = 0;
      auVar18 = auVar18 ^ _DAT_0012a3b0;
      do {
        auVar21._8_4_ = (int)uVar8;
        auVar21._0_8_ = uVar8;
        auVar21._12_4_ = (int)(uVar8 >> 0x20);
        auVar22 = (auVar21 | auVar3) ^ auVar4;
        iVar19 = auVar18._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar19 && auVar18._0_4_ < auVar22._0_4_ ||
                    iVar19 < auVar22._4_4_) & 1)) {
          costs[uVar8 + 1] = 1e+30;
        }
        if ((auVar22._12_4_ != auVar18._12_4_ || auVar22._8_4_ <= auVar18._8_4_) &&
            auVar22._12_4_ <= auVar18._12_4_) {
          costs[uVar8 + 2] = 1e+30;
        }
        auVar21 = (auVar21 | auVar20) ^ auVar4;
        iVar23 = auVar21._4_4_;
        if (iVar23 <= iVar19 && (iVar23 != iVar19 || auVar21._0_4_ <= auVar18._0_4_)) {
          costs[uVar8 + 3] = 1e+30;
          costs[uVar8 + 4] = 1e+30;
        }
        uVar8 = uVar8 + 4;
      } while ((local_288 + 3U & 0xfffffffffffffffc) != uVar8);
    }
    *costs = 0.0;
    *length_array = 0;
    if (pos < sVar14) {
      local_240 = pos + 0x103;
      local_260 = length_array + (0x102 - pos);
      local_268 = costs + -pos;
      local_250 = length_array + 3;
      local_258 = costs + 3;
      puVar15 = (unsigned_short *)pos;
      do {
        local_2c0 = (double)((long)puVar15 - pos);
        ZopfliUpdateHash(array,(size_t)puVar15,sVar14,h);
        if (((long)puVar15 + 0x205U < sVar14) && (local_240 < puVar15)) {
          if ((0x204 < h->same[(uint)puVar15 & 0x7fff]) &&
             (0x102 < h->same[(uint)puVar15 + 0x7efe & 0x7fff])) {
            local_2b0 = (*costmodel)(0x102,1,costcontext);
            puVar9 = local_260;
            pfVar7 = local_268;
            sVar14 = local_2b8;
            lVar10 = 0;
            do {
              pfVar7[(long)puVar15 + lVar10 + 0x102] =
                   (float)((double)pfVar7[(long)puVar15 + lVar10] + local_2b0);
              puVar9[(long)puVar15 + lVar10] = 0x102;
              ZopfliUpdateHash(array,lVar10 + 1 + (long)puVar15,sVar14,h);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x102);
            puVar15 = (unsigned_short *)((long)puVar15 + 0x102);
            local_2c0 = (double)((long)local_2c0 + 0x102);
          }
        }
        sVar14 = local_2b8;
        ZopfliFindLongestMatch(local_280,h,array,(size_t)puVar15,local_2b8,0x102,sublen,&dist,&leng)
        ;
        local_2a0 = (unsigned_short *)((long)puVar15 + 1);
        if (local_2a0 <= sVar14) {
          dVar16 = (*costmodel)((uint)array[(long)puVar15],0,costcontext);
          if ((double)costs[(long)local_2c0] + dVar16 < (double)costs[(long)local_2c0 + 1]) {
            costs[(long)local_2c0 + 1] = (float)((double)costs[(long)local_2c0] + dVar16);
            length_array[(long)local_2c0 + 1] = 1;
          }
        }
        puVar9 = local_250;
        pfVar7 = local_258;
        dVar16 = local_2c0;
        uVar8 = local_2b8 - (long)puVar15;
        if ((ulong)leng < local_2b8 - (long)puVar15) {
          uVar8 = (ulong)leng;
        }
        if (2 < uVar8) {
          auVar20._0_8_ = (double)costs[(long)local_2c0] + local_248;
          auVar20._8_8_ = 0;
          lVar10 = 0;
          local_2b0 = auVar20._0_8_;
          do {
            if (auVar20._0_8_ < (double)pfVar7[(long)dVar16 + lVar10]) {
              dVar17 = (*costmodel)((int)lVar10 + 3,(uint)sublen[lVar10 + 3],costcontext);
              auVar20._8_8_ = 0;
              auVar20._0_8_ = local_2b0;
              if ((double)costs[(long)local_2c0] + dVar17 < (double)pfVar7[(long)dVar16 + lVar10]) {
                pfVar7[(long)dVar16 + lVar10] = (float)((double)costs[(long)local_2c0] + dVar17);
                puVar9[(long)dVar16 + lVar10] = (short)lVar10 + 3;
              }
            }
            lVar10 = lVar10 + 1;
          } while (uVar8 - 2 != lVar10);
        }
        array = local_298;
        puVar15 = local_2a0;
        pos = local_2a8;
        sVar14 = local_2b8;
      } while (local_2a0 < local_2b8);
    }
  }
  ppuVar5 = local_278;
  free(*local_278);
  puVar6 = local_270;
  *ppuVar5 = (unsigned_short *)0x0;
  *local_270 = 0;
  lVar10 = local_288;
  dVar16 = extraout_XMM0_Qa;
  if (local_288 != 0) {
    do {
      uVar8 = *puVar6;
      if ((uVar8 & uVar8 - 1) == 0) {
        if (uVar8 == 0) {
          puVar15 = (unsigned_short *)malloc(2);
          dVar16 = extraout_XMM0_Qa_01;
        }
        else {
          puVar15 = (unsigned_short *)realloc(*ppuVar5,uVar8 << 2);
          dVar16 = extraout_XMM0_Qa_00;
        }
        *ppuVar5 = puVar15;
      }
      puVar15 = *ppuVar5;
      uVar11 = *puVar6;
      puVar15[uVar11] = length_array[lVar10];
      uVar8 = uVar11 + 1;
      *puVar6 = uVar8;
      lVar10 = lVar10 - (ulong)length_array[lVar10];
    } while (lVar10 != 0);
    sVar14 = local_2b8;
    if (1 < uVar8) {
      puVar9 = puVar15 + uVar11;
      uVar11 = 0;
      do {
        uVar1 = puVar15[uVar11];
        puVar15[uVar11] = *puVar9;
        *puVar9 = uVar1;
        uVar11 = uVar11 + 1;
        puVar9 = puVar9 + -1;
      } while (uVar8 >> 1 != uVar11);
    }
  }
  if (sVar14 != pos) {
    local_2a0 = *ppuVar5;
    local_2b0 = (double)*puVar6;
    uVar8 = 0;
    if (0x7fff < pos) {
      uVar8 = pos - 0x8000;
    }
    ZopfliResetHash(0x8000,h);
    ZopfliWarmupHash(array,uVar8,sVar14,h);
    dVar16 = extraout_XMM0_Qa_02;
    if (uVar8 < pos) {
      uVar8 = 0x8000;
      if (pos < 0x8000) {
        uVar8 = pos;
      }
      lVar10 = -uVar8;
      do {
        ZopfliUpdateHash(array,pos + lVar10,sVar14,h);
        lVar10 = lVar10 + 1;
        dVar16 = extraout_XMM0_Qa_03;
      } while (lVar10 != 0);
    }
    end = local_2b8;
    if (local_2b0 != 0.0) {
      local_2c0 = 0.0;
      do {
        length = local_2a0[(long)local_2c0];
        uVar8 = (ulong)length;
        ZopfliUpdateHash(array,pos,sVar14,h);
        local_2a8 = pos;
        if (uVar8 < 3) {
          ZopfliStoreLitLenDist((ushort)array[pos],0,pos,store);
          uVar8 = 1;
          dVar16 = extraout_XMM0_Qa_05;
        }
        else {
          ZopfliFindLongestMatch
                    (local_280,h,array,pos,sVar14,uVar8,(unsigned_short *)0x0,&leng,sublen);
          ZopfliVerifyLenDist(array,sVar14,pos,leng,length);
          ZopfliStoreLitLenDist(length,leng,pos,store);
          dVar16 = extraout_XMM0_Qa_04;
        }
        array = local_298;
        if (1 < (uint)uVar8) {
          lVar10 = uVar8 - 1;
          sVar14 = local_2a8;
          do {
            sVar14 = sVar14 + 1;
            ZopfliUpdateHash(array,sVar14,end,h);
            lVar10 = lVar10 + -1;
            dVar16 = extraout_XMM0_Qa_06;
          } while (lVar10 != 0);
        }
        pos = local_2a8 + uVar8;
        local_2c0 = (double)((long)local_2c0 + 1);
        sVar14 = end;
      } while (local_2c0 != local_2b0);
    }
  }
  return dVar16;
}

Assistant:

static double LZ77OptimalRun(ZopfliBlockState* s,
    const unsigned char* in, size_t instart, size_t inend,
    unsigned short** path, size_t* pathsize,
    unsigned short* length_array, CostModelFun* costmodel,
    void* costcontext, ZopfliLZ77Store* store,
    ZopfliHash* h, float* costs) {
  double cost = GetBestLengths(s, in, instart, inend, costmodel,
                costcontext, length_array, h, costs);
  free(*path);
  *path = 0;
  *pathsize = 0;
  TraceBackwards(inend - instart, length_array, path, pathsize);
  FollowPath(s, in, instart, inend, *path, *pathsize, store, h);
  assert(cost < ZOPFLI_LARGE_FLOAT);
  return cost;
}